

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

bool __thiscall soplex::SoPlexBase<double>::_reapplyPersistentScaling(SoPlexBase<double> *this)

{
  SoPlexBase<double> *this_local;
  bool local_1;
  
  if (((double)this->_unscaleCalls <= (double)this->_optimizeCalls * 0.1) ||
     (this->_optimizeCalls < 0xb)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::_reapplyPersistentScaling() const
{
   if((_unscaleCalls > _optimizeCalls * SOPLEX_ALLOWED_UNSCALE_PERCENTAGE)
         && _optimizeCalls > SOPLEX_MIN_OPT_CALLS_WITH_SCALING)
      return false;
   else
      return true;
}